

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O3

void grpc_cpp_generator::anon_unknown_3::PrintHeaderClientMethodInterfaces
               (Printer *printer,Method *method,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars,bool is_public)

{
  _func_int *p_Var1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  undefined3 in_register_00000009;
  long lVar5;
  anon_struct_96_3_3738e6c4 *async_prefix;
  long *plVar6;
  bool bVar7;
  anon_struct_96_3_3738e6c4 *async_prefix_1;
  anon_struct_96_3_3738e6c4 async_prefixes [2];
  key_type local_120;
  undefined4 local_fc;
  long *local_f8 [2];
  long local_e8 [2];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  (*(method->super_CommentHolder)._vptr_CommentHolder[5])(local_f8);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Method","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_120);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  (*(method->super_CommentHolder)._vptr_CommentHolder[6])(local_f8,method);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Request","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_120);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  (*(method->super_CommentHolder)._vptr_CommentHolder[7])(local_f8,method);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Response","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_120);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  local_fc = CONCAT31(in_register_00000009,is_public);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Async","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,", void* tag","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,", tag","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"PrepareAsync","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
  plVar6 = local_48;
  local_58[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  p_Var1 = (method->super_CommentHolder)._vptr_CommentHolder[0xf];
  if ((char)local_fc == '\0') {
    iVar3 = (*p_Var1)(method);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x10])(method);
      if (((char)iVar3 == '\0') ||
         (iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x11])(method),
         (char)iVar3 != '\0')) {
        iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x10])(method);
        if (((char)iVar3 == '\0') &&
           (iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x11])(method),
           (char)iVar3 != '\0')) {
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "virtual ::grpc::ClientReaderInterface< $Response$>* $Method$Raw(::grpc::ClientContext* context, const $Request$& request) = 0;\n"
                    );
          bVar2 = true;
          do {
            bVar7 = bVar2;
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"AsyncPrefix","");
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](vars,&local_120);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_120,"AsyncMethodParams","");
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](vars,&local_120);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "virtual ::grpc::ClientAsyncReaderInterface< $Response$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n"
                      );
            bVar2 = false;
          } while (bVar7);
        }
        else {
          iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x12])(method);
          if ((char)iVar3 != '\0') {
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "virtual ::grpc::ClientReaderWriterInterface< $Request$, $Response$>* $Method$Raw(::grpc::ClientContext* context) = 0;\n"
                      );
            bVar2 = true;
            do {
              bVar7 = bVar2;
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"AsyncPrefix","")
              ;
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_120);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_120,"AsyncMethodParams","");
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_120);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              (*printer->_vptr_Printer[2])
                        (printer,vars,
                         "virtual ::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, ::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n"
                        );
              bVar2 = false;
            } while (bVar7);
          }
        }
      }
      else {
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "virtual ::grpc::ClientWriterInterface< $Request$>* $Method$Raw(::grpc::ClientContext* context, $Response$* response) = 0;\n"
                  );
        bVar2 = true;
        do {
          bVar7 = bVar2;
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"AsyncPrefix","");
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](vars,&local_120);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,"AsyncMethodParams","");
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](vars,&local_120);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "virtual ::grpc::ClientAsyncWriterInterface< $Request$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, $Response$* response, ::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n"
                    );
          bVar2 = false;
        } while (bVar7);
      }
    }
    else {
      bVar2 = true;
      do {
        bVar7 = bVar2;
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"AsyncPrefix","");
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](vars,&local_120);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "virtual ::grpc::ClientAsyncResponseReaderInterface< $Response$>* $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq) = 0;\n"
                  );
        bVar2 = false;
      } while (bVar7);
    }
  }
  else {
    iVar3 = (*p_Var1)(method);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x10])(method);
      if (((char)iVar3 == '\0') ||
         (iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x11])(method),
         (char)iVar3 != '\0')) {
        iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x10])(method);
        if (((char)iVar3 == '\0') &&
           (iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x11])(method),
           (char)iVar3 != '\0')) {
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>> $Method$(::grpc::ClientContext* context, const $Request$& request) {\n"
                    );
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "return std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>>($Method$Raw(context, request));\n"
                    );
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n");
          bVar2 = true;
          do {
            bVar7 = bVar2;
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"AsyncPrefix","");
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](vars,&local_120);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_120,"AsyncMethodParams","");
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](vars,&local_120);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"AsyncRawArgs","");
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](vars,&local_120);
            std::__cxx11::string::_M_assign((string *)pmVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "std::unique_ptr< ::grpc::ClientAsyncReaderInterface< $Response$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n"
                      );
            (*printer->_vptr_Printer[5])(printer);
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "return std::unique_ptr< ::grpc::ClientAsyncReaderInterface< $Response$>>($AsyncPrefix$$Method$Raw(context, request, cq$AsyncRawArgs$));\n"
                      );
            (*printer->_vptr_Printer[6])(printer);
            (*printer->_vptr_Printer[3])(printer,"}\n");
            bVar2 = false;
          } while (bVar7);
        }
        else {
          iVar3 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x12])(method);
          if ((char)iVar3 != '\0') {
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "std::unique_ptr< ::grpc::ClientReaderWriterInterface< $Request$, $Response$>> $Method$(::grpc::ClientContext* context) {\n"
                      );
            (*printer->_vptr_Printer[5])(printer);
            (*printer->_vptr_Printer[2])
                      (printer,vars,
                       "return std::unique_ptr< ::grpc::ClientReaderWriterInterface< $Request$, $Response$>>($Method$Raw(context));\n"
                      );
            (*printer->_vptr_Printer[6])(printer);
            (*printer->_vptr_Printer[3])(printer,"}\n");
            bVar2 = true;
            do {
              bVar7 = bVar2;
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"AsyncPrefix","")
              ;
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_120);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_120,"AsyncMethodParams","");
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_120);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_120,"AsyncRawArgs","");
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](vars,&local_120);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              (*printer->_vptr_Printer[2])
                        (printer,vars,
                         "std::unique_ptr< ::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, ::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n"
                        );
              (*printer->_vptr_Printer[5])(printer);
              (*printer->_vptr_Printer[2])
                        (printer,vars,
                         "return std::unique_ptr< ::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>>($AsyncPrefix$$Method$Raw(context, cq$AsyncRawArgs$));\n"
                        );
              (*printer->_vptr_Printer[6])(printer);
              (*printer->_vptr_Printer[3])(printer,"}\n");
              bVar2 = false;
            } while (bVar7);
          }
        }
      }
      else {
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>> $Method$(::grpc::ClientContext* context, $Response$* response) {\n"
                  );
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "return std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>>($Method$Raw(context, response));\n"
                  );
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n");
        bVar2 = true;
        do {
          bVar7 = bVar2;
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"AsyncPrefix","");
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](vars,&local_120);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,"AsyncMethodParams","");
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](vars,&local_120);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"AsyncRawArgs","");
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](vars,&local_120);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "std::unique_ptr< ::grpc::ClientAsyncWriterInterface< $Request$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, $Response$* response, ::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n"
                    );
          (*printer->_vptr_Printer[5])(printer);
          (*printer->_vptr_Printer[2])
                    (printer,vars,
                     "return std::unique_ptr< ::grpc::ClientAsyncWriterInterface< $Request$>>($AsyncPrefix$$Method$Raw(context, response, cq$AsyncRawArgs$));\n"
                    );
          (*printer->_vptr_Printer[6])(printer);
          (*printer->_vptr_Printer[3])(printer,"}\n");
          bVar2 = false;
        } while (bVar7);
      }
    }
    else {
      (*printer->_vptr_Printer[2])
                (printer,vars,
                 "virtual ::grpc::Status $Method$(::grpc::ClientContext* context, const $Request$& request, $Response$* response) = 0;\n"
                );
      bVar2 = true;
      do {
        bVar7 = bVar2;
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"AsyncPrefix","");
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](vars,&local_120);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "std::unique_ptr< ::grpc::ClientAsyncResponseReaderInterface< $Response$>> $AsyncPrefix$$Method$(::grpc::ClientContext* context, const $Request$& request, ::grpc::CompletionQueue* cq) {\n"
                  );
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])
                  (printer,vars,
                   "return std::unique_ptr< ::grpc::ClientAsyncResponseReaderInterface< $Response$>>($AsyncPrefix$$Method$Raw(context, request, cq));\n"
                  );
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n");
        bVar2 = false;
      } while (bVar7);
    }
  }
  lVar5 = -0xc0;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    if (plVar6 + -4 != (long *)plVar6[-6]) {
      operator_delete((long *)plVar6[-6],plVar6[-4] + 1);
    }
    if (plVar6 + -8 != (long *)plVar6[-10]) {
      operator_delete((long *)plVar6[-10],plVar6[-8] + 1);
    }
    plVar6 = plVar6 + -0xc;
    lVar5 = lVar5 + 0x60;
  } while (lVar5 != 0);
  return;
}

Assistant:

static void PrintHeaderClientMethodInterfaces(
    grpc_generator::Printer *printer, const grpc_generator::Method *method,
    std::map<grpc::string, grpc::string> *vars, bool is_public) {
  (*vars)["Method"] = method->name();
  (*vars)["Request"] = method->input_type_name();
  (*vars)["Response"] = method->output_type_name();

  struct {
    grpc::string prefix;
    grpc::string method_params;  // extra arguments to method
    grpc::string raw_args;       // extra arguments to raw version of method
  } async_prefixes[] = { { "Async", ", void* tag", ", tag" },
                         { "PrepareAsync", "", "" } };

  if (is_public) {
    if (method->NoStreaming()) {
      printer->Print(
          *vars,
          "virtual ::grpc::Status $Method$(::grpc::ClientContext* context, "
          "const $Request$& request, $Response$* response) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        printer->Print(
            *vars,
            "std::unique_ptr< "
            "::grpc::ClientAsyncResponseReaderInterface< $Response$>> "
            "$AsyncPrefix$$Method$(::grpc::ClientContext* context, "
            "const $Request$& request, "
            "::grpc::CompletionQueue* cq) {\n");
        printer->Indent();
        printer->Print(
            *vars,
            "return std::unique_ptr< "
            "::grpc::ClientAsyncResponseReaderInterface< $Response$>>("
            "$AsyncPrefix$$Method$Raw(context, request, cq));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    } else if (ClientOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>>"
          " $Method$("
          "::grpc::ClientContext* context, $Response$* response) {\n");
      printer->Indent();
      printer->Print(
          *vars,
          "return std::unique_ptr< ::grpc::ClientWriterInterface< $Request$>>"
          "($Method$Raw(context, response));\n");
      printer->Outdent();
      printer->Print("}\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        (*vars)["AsyncRawArgs"] = async_prefix.raw_args;
        printer->Print(
            *vars,
            "std::unique_ptr< ::grpc::ClientAsyncWriterInterface< $Request$>>"
            " $AsyncPrefix$$Method$(::grpc::ClientContext* context, "
            "$Response$* "
            "response, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n");
        printer->Indent();
        printer->Print(*vars,
                       "return std::unique_ptr< "
                       "::grpc::ClientAsyncWriterInterface< $Request$>>("
                       "$AsyncPrefix$$Method$Raw(context, response, "
                       "cq$AsyncRawArgs$));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    } else if (ServerOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>>"
          " $Method$(::grpc::ClientContext* context, const $Request$& request)"
          " {\n");
      printer->Indent();
      printer->Print(
          *vars,
          "return std::unique_ptr< ::grpc::ClientReaderInterface< $Response$>>"
          "($Method$Raw(context, request));\n");
      printer->Outdent();
      printer->Print("}\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        (*vars)["AsyncRawArgs"] = async_prefix.raw_args;
        printer->Print(
            *vars,
            "std::unique_ptr< ::grpc::ClientAsyncReaderInterface< $Response$>> "
            "$AsyncPrefix$$Method$("
            "::grpc::ClientContext* context, const $Request$& request, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n");
        printer->Indent();
        printer->Print(
            *vars,
            "return std::unique_ptr< "
            "::grpc::ClientAsyncReaderInterface< $Response$>>("
            "$AsyncPrefix$$Method$Raw(context, request, cq$AsyncRawArgs$));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    } else if (method->BidiStreaming()) {
      printer->Print(*vars,
                     "std::unique_ptr< ::grpc::ClientReaderWriterInterface< "
                     "$Request$, $Response$>> "
                     "$Method$(::grpc::ClientContext* context) {\n");
      printer->Indent();
      printer->Print(
          *vars,
          "return std::unique_ptr< "
          "::grpc::ClientReaderWriterInterface< $Request$, $Response$>>("
          "$Method$Raw(context));\n");
      printer->Outdent();
      printer->Print("}\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        (*vars)["AsyncRawArgs"] = async_prefix.raw_args;
        printer->Print(
            *vars,
            "std::unique_ptr< "
            "::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>> "
            "$AsyncPrefix$$Method$(::grpc::ClientContext* context, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) {\n");
        printer->Indent();
        printer->Print(
            *vars,
            "return std::unique_ptr< "
            "::grpc::ClientAsyncReaderWriterInterface< $Request$, $Response$>>("
            "$AsyncPrefix$$Method$Raw(context, cq$AsyncRawArgs$));\n");
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  } else {
    if (method->NoStreaming()) {
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncResponseReaderInterface< $Response$>* "
            "$AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, "
            "const $Request$& request, "
            "::grpc::CompletionQueue* cq) = 0;\n");
      }
    } else if (ClientOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "virtual ::grpc::ClientWriterInterface< $Request$>*"
          " $Method$Raw("
          "::grpc::ClientContext* context, $Response$* response) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncWriterInterface< $Request$>*"
            " $AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, "
            "$Response$* response, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n");
      }
    } else if (ServerOnlyStreaming(method)) {
      printer->Print(
          *vars,
          "virtual ::grpc::ClientReaderInterface< $Response$>* "
          "$Method$Raw("
          "::grpc::ClientContext* context, const $Request$& request) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncReaderInterface< $Response$>* "
            "$AsyncPrefix$$Method$Raw("
            "::grpc::ClientContext* context, const $Request$& request, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n");
      }
    } else if (method->BidiStreaming()) {
      printer->Print(*vars,
                     "virtual ::grpc::ClientReaderWriterInterface< $Request$, "
                     "$Response$>* "
                     "$Method$Raw(::grpc::ClientContext* context) = 0;\n");
      for (size_t i = 0; i < sizeof(async_prefixes) / sizeof(async_prefixes[0]);
           i++) {
        auto &async_prefix = async_prefixes[i];
        (*vars)["AsyncPrefix"] = async_prefix.prefix;
        (*vars)["AsyncMethodParams"] = async_prefix.method_params;
        printer->Print(
            *vars,
            "virtual ::grpc::ClientAsyncReaderWriterInterface< "
            "$Request$, $Response$>* "
            "$AsyncPrefix$$Method$Raw(::grpc::ClientContext* context, "
            "::grpc::CompletionQueue* cq$AsyncMethodParams$) = 0;\n");
      }
    }
  }
}